

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlInitializeSpecial(Ssw_Sml_t *p,Vec_Int_t *vInit)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = p->pAig->nRegs;
  if ((int)uVar1 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a5,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  if (p->pAig->nObjs[2] < (int)uVar1) {
    __assert_fail("nRegs <= Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a6,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  if (vInit->nSize != p->nWordsFrame * uVar1) {
    __assert_fail("Vec_IntSize(vInit) == nRegs * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a7,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  pAVar3 = p->pAig;
  if (0 < pAVar3->nTruePis) {
    lVar5 = 0;
    do {
      if (pAVar3->vCis->nSize <= lVar5) goto LAB_0061e5d7;
      Ssw_SmlAssignRandom(p,(Aig_Obj_t *)pAVar3->vCis->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pAVar3 = p->pAig;
    } while (lVar5 < pAVar3->nTruePis);
  }
  if (0 < vInit->nSize) {
    uVar6 = 0;
    do {
      uVar4 = (int)((uVar6 & 0xffffffff) % (ulong)uVar1) + p->pAig->nTruePis;
      if (((int)uVar4 < 0) || (pVVar2 = p->pAig->vCis, pVVar2->nSize <= (int)uVar4)) {
LAB_0061e5d7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ssw_SmlObjAssignConstWord
                (p,(Aig_Obj_t *)pVVar2->pArray[uVar4],vInit->pArray[uVar6],0,
                 (int)((uVar6 & 0xffffffff) / (ulong)uVar1));
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)vInit->nSize);
  }
  return;
}

Assistant:

void Ssw_SmlInitializeSpecial( Ssw_Sml_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj;
    int Entry, i, nRegs;
    nRegs = Aig_ManRegNum(p->pAig);
    assert( nRegs > 0 );
    assert( nRegs <= Aig_ManCiNum(p->pAig) );
    assert( Vec_IntSize(vInit) == nRegs * p->nWordsFrame );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // assign the initial state for the latches
    Vec_IntForEachEntry( vInit, Entry, i )
        Ssw_SmlObjAssignConstWord( p, Saig_ManLo(p->pAig, i % nRegs), Entry, 0, i / nRegs );
}